

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

Status cmsys::SystemTools::GetPermissions(char *file,mode_t *mode)

{
  size_t sVar1;
  Status SVar2;
  string local_40;
  
  if (file == (char *)0x0) {
    SVar2.Kind_ = POSIX;
    SVar2.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x16;
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    sVar1 = strlen(file);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,file,file + sVar1);
    SVar2 = GetPermissions(&local_40,mode);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return SVar2;
}

Assistant:

Status SystemTools::GetPermissions(const char* file, mode_t& mode)
{
  if (!file) {
    return Status::POSIX(EINVAL);
  }
  return SystemTools::GetPermissions(std::string(file), mode);
}